

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O1

void do_role(CHAR_DATA *ch,char *argument)

{
  PC_DATA *pPVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *ch_00;
  size_t sVar5;
  size_t sVar6;
  BUFFER *buffer;
  char obuf [16384];
  char arg1 [16384];
  char local_8028 [16384];
  uint local_4028;
  char local_4024;
  
  bVar2 = is_npc(ch);
  if (bVar2) {
    return;
  }
  if (*argument == '\0') {
LAB_002553b4:
    show_role(ch);
    if (ch->pcdata->temp_role != (char *)0x0) {
      show_temp_role(ch);
    }
  }
  else {
    smash_tilde(argument);
    pcVar4 = one_argument(argument,(char *)&local_4028);
    if (((local_4024 == '\0' && local_4028 == 0x776f6873) && (bVar2 = is_immortal(ch), bVar2)) &&
       (iVar3 = get_trust(ch), 0x34 < iVar3)) {
      ch_00 = get_char_world(ch,pcVar4);
      if (ch_00 == (CHAR_DATA *)0x0) {
        pcVar4 = "They aren\'t here.\n\r";
      }
      else {
        bVar2 = is_npc(ch_00);
        if (bVar2) {
          pcVar4 = "You can\'t role a mob.\n\r";
        }
        else {
          send_to_char(ch_00->true_name,ch);
          send_to_char("\'s role:\n\r",ch);
          pcVar4 = ch_00->pcdata->role;
          if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
            buffer = new_buf();
            add_buf(buffer,ch_00->pcdata->role);
            pcVar4 = buf_string(buffer);
            page_to_char(pcVar4,ch);
            free_buf(buffer);
            return;
          }
          pcVar4 = "No role available.\n\r";
        }
      }
    }
    else if ((local_4028 & 0xffff) == 0x2b) {
      local_8028[0] = '\0';
      pPVar1 = ch->pcdata;
      if (pPVar1->temp_role != (char *)0x0) {
        strcat(local_8028,pPVar1->temp_role);
      }
      if (*pcVar4 == '\0') {
        pcVar4 = " ";
      }
      strcat(local_8028,pcVar4);
      sVar5 = strlen(local_8028);
      (local_8028 + sVar5)[0] = '\n';
      (local_8028 + sVar5)[1] = '\r';
      local_8028[sVar5 + 2] = '\0';
      sVar5 = strlen(local_8028);
      if (pPVar1->role == (char *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = strlen(pPVar1->role);
      }
      if (sVar6 + sVar5 < 0x3c19) {
        free_pstring(pPVar1->temp_role);
        pcVar4 = palloc_string(local_8028);
        ch->pcdata->temp_role = pcVar4;
        pcVar4 = "Ok.\n\r";
      }
      else {
        pcVar4 = "Sorry, your role is too long.\n\r";
      }
    }
    else if ((local_4028 & 0xffff) == 0x2d) {
      pPVar1 = ch->pcdata;
      pcVar4 = pPVar1->temp_role;
      if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
        pcVar4 = "No lines left to remove.\n\r";
      }
      else {
        strcpy(local_8028,pcVar4);
        sVar5 = strlen(local_8028);
        if (sVar5 != 0) {
          bVar2 = false;
          do {
            if (local_8028[sVar5] == '\r') {
              if (bVar2) {
                local_8028[sVar5 + 1] = '\0';
                pcVar4 = pPVar1->temp_role;
                goto LAB_00255503;
              }
              sVar5 = sVar5 - 1;
              bVar2 = true;
            }
            sVar5 = sVar5 - 1;
          } while (sVar5 != 0);
        }
        local_8028[0] = '\0';
        pcVar4 = ch->pcdata->temp_role;
LAB_00255503:
        free_pstring(pcVar4);
        pcVar4 = palloc_string(local_8028);
        ch->pcdata->temp_role = pcVar4;
        pcVar4 = "Line deleted.\n\r";
      }
    }
    else if (local_4028 == 0x646461) {
      pcVar4 = ch->pcdata->temp_role;
      if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
        add_role(ch,pcVar4);
        free_pstring(ch->pcdata->temp_role);
        ch->pcdata->temp_role = (char *)0x0;
        show_role(ch);
        return;
      }
      pcVar4 = "You have no role in progress to add.\n\r";
    }
    else {
      bVar2 = str_cmp((char *)&local_4028,"format");
      if (bVar2) goto LAB_002553b4;
      pcVar4 = ch->pcdata->temp_role;
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "You have no role in progress to format.\n\r";
      }
      else {
        pcVar4 = format_string(pcVar4);
        ch->pcdata->temp_role = pcVar4;
        pcVar4 = "Your role in progress has been formatted.\n\r";
      }
    }
    send_to_char(pcVar4,ch);
  }
  return;
}

Assistant:

void do_role(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_BUF], arg1[MAX_BUF], obuf[MAX_BUF];

	if (is_npc(ch))
		return;

	if (argument[0] != '\0')
	{
		buf[0] = '\0';
		smash_tilde(argument);
		argument = one_argument(argument, arg1);

		if (!strcmp(arg1, "show") && is_immortal(ch) && get_trust(ch) > 52)
		{
			auto victim = get_char_world(ch, argument);
			if (victim == nullptr)
			{
				send_to_char("They aren't here.\n\r", ch);
				return;
			}

			if (is_npc(victim))
			{
				send_to_char("You can't role a mob.\n\r", ch);
				return;
			}

			send_to_char(victim->true_name, ch);
			send_to_char("'s role:\n\r", ch);

			if (victim->pcdata->role == nullptr || victim->pcdata->role[0] == '\0')
			{
				send_to_char("No role available.\n\r", ch);
				return;
			}

			auto output = new_buf();
			add_buf(output, victim->pcdata->role);
			page_to_char(buf_string(output), ch);
			free_buf(output);
			return;
		}

		if (!strcmp(arg1, "-"))
		{
			if (ch->pcdata->temp_role == nullptr || ch->pcdata->temp_role[0] == '\0')
			{
				send_to_char("No lines left to remove.\n\r", ch);
				return;
			}

			strcpy(obuf, ch->pcdata->temp_role);

			auto found = false;
			for (auto len = strlen(obuf); len > 0; len--)
			{
				if (obuf[len] != '\r')
					continue;

				if (!found)
				{
					if (len > 0)
						len--;

					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';
					free_pstring(ch->pcdata->temp_role);
					ch->pcdata->temp_role = palloc_string(obuf);

					send_to_char("Line deleted.\n\r", ch);
					return;
				}
			}

			obuf[0] = '\0';
			free_pstring(ch->pcdata->temp_role);
			ch->pcdata->temp_role = palloc_string(obuf);

			send_to_char("Line deleted.\n\r", ch);
			return;
		}

		if (!strcmp(arg1, "+"))
		{
			obuf[0] = '\0';

			if (ch->pcdata->temp_role)
				strcat(obuf, ch->pcdata->temp_role);

			strcat(obuf, argument[0] != '\0' ? argument : " ");
			strcat(obuf, "\n\r");

			if (strlen(obuf) + (ch->pcdata->role ? strlen(ch->pcdata->role) : 0) > MAX_BUF - 1000)
			{
				send_to_char("Sorry, your role is too long.\n\r", ch);
				return;
			}

			free_pstring(ch->pcdata->temp_role);
			ch->pcdata->temp_role = palloc_string(obuf);

			send_to_char("Ok.\n\r", ch);
			return;
		}

		if (!strcmp(arg1, "add"))
		{
			if (ch->pcdata->temp_role == nullptr || ch->pcdata->temp_role[0] == '\0')
			{
				send_to_char("You have no role in progress to add.\n\r", ch);
				return;
			}
			else
			{
				add_role(ch, ch->pcdata->temp_role);
				free_pstring(ch->pcdata->temp_role);
				ch->pcdata->temp_role = nullptr;
				show_role(ch);
			}

			return;
		}

		if (!str_cmp(arg1, "format"))
		{
			if (!ch->pcdata->temp_role)
			{
				send_to_char("You have no role in progress to format.\n\r", ch);
				return;
			}

			ch->pcdata->temp_role = format_string(ch->pcdata->temp_role);

			send_to_char("Your role in progress has been formatted.\n\r", ch);
			return;
		}
	}

	show_role(ch);

	if (ch->pcdata->temp_role != nullptr)
		show_temp_role(ch);
}